

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_add_reader(bcf_srs_t *files,char *fname)

{
  bcf_sr_error *pbVar1;
  bcf_sr_t *pbVar2;
  htsExactFormat hVar3;
  char *pcVar4;
  int iVar5;
  htsFile *hfp;
  int *piVar6;
  bcf_sr_t *pbVar7;
  tbx_t *ptVar8;
  bcf_hdr_t *pbVar9;
  hts_idx_t *phVar10;
  char *pcVar11;
  char **__ptr;
  bcf_sr_regions_t *pbVar12;
  ulong uVar13;
  char *id;
  char *__src;
  long lVar14;
  ulong __size;
  int iVar15;
  size_t __n;
  long lVar16;
  int n;
  int local_74;
  char *local_70;
  bcf_sr_t *local_68;
  char *local_60;
  bcf_srs_t *local_58;
  char *local_50;
  bcf_hdr_t *local_48;
  int *local_40;
  long local_38;
  
  hfp = hts_open(fname,"r");
  if (hfp == (htsFile *)0x0) {
    files->errnum = open_failed;
    return 0;
  }
  piVar6 = (int *)realloc(files->has_line,(long)files->nreaders * 4 + 4);
  files->has_line = piVar6;
  iVar15 = files->nreaders;
  piVar6[iVar15] = 0;
  pbVar7 = (bcf_sr_t *)realloc(files->readers,(long)iVar15 * 0x60 + 0x60);
  files->readers = pbVar7;
  iVar15 = files->nreaders;
  files->nreaders = iVar15 + 1;
  pbVar2 = pbVar7 + iVar15;
  pbVar7[iVar15].file = (htsFile *)0x0;
  pbVar7[iVar15].tbx_idx = (tbx_t *)0x0;
  pbVar7[iVar15].bcf_idx = (hts_idx_t *)0x0;
  (&pbVar7[iVar15].bcf_idx)[1] = (hts_idx_t *)0x0;
  pbVar7[iVar15].itr = (hts_itr_t *)0x0;
  (&pbVar7[iVar15].itr)[1] = (hts_itr_t *)0x0;
  pbVar7[iVar15].buffer = (bcf1_t **)0x0;
  (&pbVar7[iVar15].buffer)[1] = (bcf1_t **)0x0;
  *(undefined8 *)&pbVar7[iVar15].nfilter_ids = 0;
  *(int **)(&pbVar7[iVar15].nfilter_ids + 2) = (int *)0x0;
  pbVar7[iVar15].samples = (int *)0x0;
  (&pbVar7[iVar15].samples)[1] = (int *)0x0;
  pbVar7[iVar15].file = hfp;
  pbVar1 = &files->errnum;
  files->errnum = open_failed;
  hVar3 = (hfp->format).format;
  if (files->require_index == 0) {
    if ((hVar3 & ~binary_format) != vcf) {
LAB_00113ed4:
      *pbVar1 = file_type_error;
      return 0;
    }
    pbVar9 = bcf_hdr_read(hfp);
    pbVar2->header = pbVar9;
    files->streaming = 1;
  }
  else if (hVar3 == bcf) {
    if ((hfp->format).compression != bgzf) {
LAB_001140ad:
      *pbVar1 = not_bgzf;
      return 0;
    }
    pbVar9 = bcf_hdr_read(hfp);
    pbVar2->header = pbVar9;
    phVar10 = hts_idx_load(fname,0);
    pbVar2->bcf_idx = phVar10;
    if (phVar10 == (hts_idx_t *)0x0) {
      *pbVar1 = idx_load_failed;
      return 0;
    }
  }
  else {
    if (hVar3 != vcf) goto LAB_00113ed4;
    if ((hfp->format).compression != bgzf) goto LAB_001140ad;
    ptVar8 = tbx_index_load(fname);
    pbVar2->tbx_idx = ptVar8;
    if (ptVar8 == (tbx_t *)0x0) {
      *pbVar1 = idx_load_failed;
      return 0;
    }
    pbVar9 = bcf_hdr_read(pbVar2->file);
    pbVar2->header = pbVar9;
  }
  if (files->streaming != 0) {
    if (1 < files->nreaders) {
      *pbVar1 = api_usage_error;
      fprintf(_stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0xd0,"bcf_sr_add_reader");
      return 0;
    }
    if ((files->streaming != 0) && (files->regions != (bcf_sr_regions_t *)0x0)) {
      bcf_sr_add_reader_cold_1();
      return 0;
    }
  }
  local_48 = pbVar2->header;
  if (local_48 == (bcf_hdr_t *)0x0) {
    *pbVar1 = header_error;
    return 0;
  }
  pbVar2->fname = fname;
  __src = files->apply_filters;
  local_68 = pbVar2;
  if (__src != (char *)0x0) {
    lVar14 = (long)__src << 0x20;
    local_60 = __src + -1;
    __size = 0;
    local_70 = (char *)0x0;
    iVar15 = 0;
    piVar6 = (int *)0x0;
    pcVar4 = __src;
    local_58 = files;
    do {
      if ((*pcVar4 == ',') || (*pcVar4 == '\0')) {
        lVar16 = (long)iVar15;
        piVar6 = (int *)realloc(piVar6,lVar16 * 4 + 4);
        id = local_70;
        if ((__src != local_60) || (iVar5 = -1, *__src != '.')) {
          __n = lVar14 - ((long)__src << 0x20) >> 0x20;
          uVar13 = __n + 1;
          pcVar11 = local_70;
          local_40 = piVar6;
          local_38 = lVar14;
          if (uVar13 < __size) {
LAB_0011404e:
            id = pcVar11;
            memcpy(id,__src,__n);
            id[__n] = '\0';
          }
          else {
            uVar13 = uVar13 >> 1 | uVar13;
            uVar13 = uVar13 >> 2 | uVar13;
            uVar13 = uVar13 >> 4 | uVar13;
            uVar13 = uVar13 >> 8 | uVar13;
            __size = (uVar13 >> 0x10 | uVar13) + 1;
            local_50 = __src;
            pcVar11 = (char *)realloc(local_70,__size);
            __src = local_50;
            if (pcVar11 != (char *)0x0) goto LAB_0011404e;
          }
          local_70 = id;
          iVar5 = bcf_hdr_id2int(local_48,0,id);
          piVar6 = local_40;
          lVar14 = local_38;
        }
        iVar15 = iVar15 + 1;
        piVar6[lVar16] = iVar5;
        __src = pcVar4 + 1;
        if (*pcVar4 == '\0') goto LAB_001140b7;
      }
      lVar14 = lVar14 + 0x100000000;
      local_60 = local_60 + 1;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
LAB_001140de:
  if ((files->explicit_regs == 0) && (files->streaming == 0)) {
    if (local_68->tbx_idx == (tbx_t *)0x0) {
      __ptr = bcf_hdr_seqnames(local_68->header,&local_74);
    }
    else {
      __ptr = tbx_seqnames(local_68->tbx_idx,&local_74);
    }
    if (0 < local_74) {
      lVar14 = 0;
      do {
        if (files->regions == (bcf_sr_regions_t *)0x0) {
          pbVar12 = _regions_init_string(__ptr[lVar14]);
          files->regions = pbVar12;
        }
        else {
          _regions_add(files->regions,__ptr[lVar14],-1,-1);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < local_74);
    }
    free(__ptr);
  }
  return 1;
LAB_001140b7:
  if (__size != 0) {
    free(local_70);
  }
  local_68->nfilter_ids = iVar15;
  local_68->filter_ids = piVar6;
  files = local_58;
  goto LAB_001140de;
}

Assistant:

int bcf_sr_add_reader(bcf_srs_t *files, const char *fname)
{
    htsFile* file_ptr = hts_open(fname, "r");
    if ( ! file_ptr ) {
        files->errnum = open_failed;
        return 0;
    }

    files->has_line = (int*) realloc(files->has_line, sizeof(int)*(files->nreaders+1));
    files->has_line[files->nreaders] = 0;
    files->readers  = (bcf_sr_t*) realloc(files->readers, sizeof(bcf_sr_t)*(files->nreaders+1));
    bcf_sr_t *reader = &files->readers[files->nreaders++];
    memset(reader,0,sizeof(bcf_sr_t));

    reader->file = file_ptr;

    files->errnum = 0;

    if ( files->require_index )
    {
        if ( reader->file->format.format==vcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->tbx_idx = tbx_index_load(fname);
            if ( !reader->tbx_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);
        }
        else if ( reader->file->format.format==bcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);

            reader->bcf_idx = bcf_index_load(fname);
            if ( !reader->bcf_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
    }
    else
    {
        if ( reader->file->format.format==bcf || reader->file->format.format==vcf )
        {
            reader->header = bcf_hdr_read(reader->file);
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
        files->streaming = 1;
    }
    if ( files->streaming && files->nreaders>1 )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n", __FILE__,__LINE__,__FUNCTION__,files->nreaders);
        return 0;
    }
    if ( files->streaming && files->regions )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n", __FILE__,__LINE__,__FUNCTION__);
        return 0;
    }
    if ( !reader->header )
    {
        files->errnum = header_error;
        return 0;
    }

    reader->fname = fname;
    if ( files->apply_filters )
        reader->filter_ids = init_filters(reader->header, files->apply_filters, &reader->nfilter_ids);

    // Update list of chromosomes
    if ( !files->explicit_regs && !files->streaming )
    {
        int n,i;
        const char **names = reader->tbx_idx ? tbx_seqnames(reader->tbx_idx, &n) : bcf_hdr_seqnames(reader->header, &n);
        for (i=0; i<n; i++)
        {
            if ( !files->regions )
                files->regions = _regions_init_string(names[i]);
            else
                _regions_add(files->regions, names[i], -1, -1);
        }
        free(names);
    }

    return 1;
}